

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_array_size
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  String *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar8;
  uint *puVar9;
  bool bVar10;
  bool bVar11;
  allocator<char> local_4d6;
  allocator<char> local_4d5;
  uint local_4d4;
  String local_4d0;
  String local_4b0;
  LayoutBindingTestResult *local_490;
  StringVector list;
  StringIntMap bindingPoints;
  long *local_428 [2];
  long local_418 [2];
  IProgramContextSupplier *local_408;
  code *local_400;
  uint *local_3f8;
  String local_3f0;
  String decl;
  vector<int,_std::allocator<int>_> arraySizes;
  String local_398;
  String local_378;
  long *local_358 [2];
  long local_348 [2];
  ostringstream texUnitStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x21])(this);
  LayoutBindingBaseCase::makeSparseRange(&arraySizes,&this->super_LayoutBindingBaseCase,iVar6,1);
  bVar11 = true;
  bVar10 = arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start <
           arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (bVar10) {
    local_408 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
    pSVar1 = &__return_storage_ptr__->m_reason;
    local_400 = glUniformMatrix3x2fv;
    paVar2 = &(__return_storage_ptr__->m_reason).field_2;
    bVar11 = true;
    puVar9 = (uint *)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_490 = __return_storage_ptr__;
    do {
      uVar4 = *puVar9;
      local_3f8 = puVar9;
      std::ios_base::ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = local_400;
      s.super_ostringstream._328_8_ = 0;
      s.super_ostringstream._336_2_ = 0;
      s.super_ostringstream._360_8_ = 0;
      s.super_ostringstream._368_8_ = 0;
      s.super_ostringstream._344_8_ = 0;
      s.super_ostringstream._352_8_ = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&PTR__StringStream_02143dd0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
           &PTR__StringStream_02143df8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"[",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)&s,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
      local_4d4 = uVar4;
      iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texUnitStr,*(char **)CONCAT44(extraout_var,iVar6),&local_4d5);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1a])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints
                 ,this,0);
      iVar6 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,*(char **)(CONCAT44(extraout_var_00,iVar6) + 0x18),&local_4d6)
      ;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&list,this,0);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1c])(&local_4d0,this,&list);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_358,this,0);
      local_428[0] = local_418;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"float","");
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1d])(&local_3f0,this,local_358,(string *)local_428);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_378,this,0);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1e])(&local_398,this,(ulong)local_4d4);
      LayoutBindingBaseCase::buildUniformDecl
                (&decl,&this->super_LayoutBindingBaseCase,(String *)&texUnitStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints
                 ,&local_4b0,&local_4d0,&local_3f0,&local_378,&local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if (local_428[0] != local_418) {
        operator_delete(local_428[0],local_418[0] + 1);
      }
      if (local_358[0] != local_348) {
        operator_delete(local_358[0],local_348[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if (texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _17_7_,texUnitStr.
                                        super_basic_ostream<char,_std::char_traits<char>_>._16_1_) +
                        1);
      }
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_DECL",&decl);
      StringStream::reset(&s);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&s,"float accumulate(void)\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"  float acc = 0.0;\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"  for(int i=0; i < ",0x13);
      poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)&s,local_4d4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ; i++)\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&s,"    acc = float(atomicCounter(",0x1e);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])((String *)&texUnitStr,this,0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&s,
                          (char *)texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream,
                          texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[i]));\n",7);
      if (texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _17_7_,texUnitStr.
                                        super_basic_ostream<char,_std::char_traits<char>_>._16_1_) +
                        1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"  return acc;\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"}\n",2);
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"OPTIONAL_FUNCTION_BLOCK",(String *)&texUnitStr);
      if (texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _17_7_,texUnitStr.
                                        super_basic_ostream<char,_std::char_traits<char>_>._16_1_) +
                        1);
      }
      StringStream::reset(&s);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&s,"vec4(accumulate(), 1.0, 0.0, 1.0);\n",0x23);
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_ACCESS",(String *)&texUnitStr);
      if (texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _17_7_,texUnitStr.
                                        super_basic_ostream<char,_std::char_traits<char>_>._16_1_) +
                        1);
      }
      LayoutBindingBaseCase::updateTemplate
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                );
      puVar3 = &texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)puVar3;
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"OPTIONAL_FUNCTION_BLOCK",(String *)&texUnitStr);
      if (texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)puVar3) {
        operator_delete(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _17_7_,texUnitStr.
                                        super_basic_ostream<char,_std::char_traits<char>_>._16_1_) +
                        1);
      }
      iVar6 = (*local_408->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar6);
      bVar5 = LayoutBindingProgram::compiledAndLinked(this_00);
      if ((bVar11 & bVar5) == 0) {
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&texUnitStr,this_00,false);
        local_490->m_passed = false;
        local_490->m_notRunForThisContext = false;
        (local_490->m_reason)._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pSVar1,
                   texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                   ,texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                    (long)texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
        if (texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)&texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
        {
          operator_delete(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          CONCAT71(texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _17_7_,texUnitStr.
                                          super_basic_ostream<char,_std::char_traits<char>_>._16_1_)
                          + 1);
        }
        bVar11 = false;
      }
      else {
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&texUnitStr);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &bindingPoints,this,0);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&texUnitStr,(char *)bindingPoints._M_t._M_impl._0_8_,
                            bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[0]",3);
        if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
            &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                          (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_parent)->_M_color + 1));
        }
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &bindingPoints);
        if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
            &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                          (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_parent)->_M_color + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,&list);
        (*this_00->_vptr_LayoutBindingProgram[3])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &bindingPoints,this_00,&local_1c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&bindingPoints,
                              list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        bVar11 = *pmVar8 == 0;
        if (!bVar11) {
          local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4d0,"binding point did not match default","");
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)&bindingPoints,
                                list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          LayoutBindingBaseCase::generateLog<int,int>
                    (&local_4b0,&this->super_LayoutBindingBaseCase,&local_4d0,*pmVar8,1);
          local_490->m_passed = false;
          local_490->m_notRunForThisContext = false;
          (local_490->m_reason)._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)pSVar1,local_4b0._M_dataplus._M_p,
                     local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)&bindingPoints);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&texUnitStr);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &texUnitStr.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&list);
      }
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      __return_storage_ptr__ = local_490;
      if (bVar11 == false) break;
      puVar9 = local_3f8 + 1;
      bVar10 = puVar9 < arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    } while (bVar10);
  }
  if (!bVar10) {
    puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
    __return_storage_ptr__->m_passed = bVar11;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,puVar3,puVar3);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar3) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
  }
  if (arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_array_size(void)
	{
		bool passed = true;

		//== test different sized arrays
		std::vector<int> arraySizes = makeSparseRange(maxArraySize(), 1);
		for (std::vector<int>::iterator it = arraySizes.begin(); it < arraySizes.end(); it++)
		{
			int			 arraySize = *it;
			StringStream s;
			s << "[" << arraySize << "]";
			String decl =
				buildUniformDecl(String(getTestParameters().keyword), buildLayout(0),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
			setTemplateParam("UNIFORM_DECL", decl);

			s.reset();
			// build a function that accesses the whole array
			s << "float accumulate(void)\n";
			s << "{\n";
			s << "  float acc = 0.0;\n";
			s << "  for(int i=0; i < " << arraySize << " ; i++)\n";
			s << "    acc = float(atomicCounter(" << getDefaultUniformName() << "[i]));\n";
			s << "  return acc;\n";
			s << "}\n";

			setTemplateParam("OPTIONAL_FUNCTION_BLOCK", s.str());

			s.reset();
			s << "vec4(accumulate(), 1.0, 0.0, 1.0);\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());
			updateTemplate();

			setTemplateParam("OPTIONAL_FUNCTION_BLOCK", String());

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector	   list;
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName() << "[0]";
			list.push_back(texUnitStr.str());

			StringIntMap bindingPoints = program->getBindingPoints(list);
			passed &= (0 == bindingPoints[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("binding point did not match default"), bindingPoints[list[0]], 1));
			}
		}

		return LayoutBindingTestResult(passed, String());
	}